

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O2

int __thiscall GrcSymbolTableEntry::FieldIndex(GrcSymbolTableEntry *this,string *sta)

{
  __type _Var1;
  int cRet;
  int iVar2;
  
  iVar2 = -1;
  for (; this != (GrcSymbolTableEntry *)0x0; this = this->m_psymtbl->m_psymParent) {
    _Var1 = std::operator==(&this->m_staFieldName,sta);
    if (_Var1) {
      iVar2 = this->m_psymtbl->m_cLevel;
    }
  }
  return iVar2;
}

Assistant:

int GrcSymbolTableEntry::FieldIndex(std::string sta)
{
	int cRet = -1;
	Symbol psymCurr = this;
	while (psymCurr)
	{
		if (psymCurr->m_staFieldName == sta)
			cRet = psymCurr->Level();
		psymCurr = psymCurr->m_psymtbl->m_psymParent;
	}
	return cRet;
}